

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86instapi.cpp
# Opt level: O0

Error asmjit::v1_14::x86::InstInternal::validate
                (Mode mode,BaseInst *inst,Operand_ *operands,size_t opCount,
                ValidationFlags validationFlags)

{
  undefined4 uVar1;
  undefined4 uVar2;
  bool bVar3;
  Error EVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  OpSignature *pOVar7;
  InstSignature *pIVar8;
  uint *puVar9;
  ulong in_RCX;
  Operand_ *in_RDX;
  uint *in_RSI;
  Mode in_DIL;
  uint in_R8D;
  RegOnly *extraReg;
  OpSignature *oRef;
  OpSignature *oChk;
  uint32_t r;
  bool localImmOutOfRange;
  uint32_t iSigCount;
  uint32_t j;
  bool globalImmOutOfRange;
  OpSignature *opSignatureTable;
  InstSignature *iEnd;
  InstSignature *iSig;
  bool hasREX;
  OpSignature *oSigDst;
  uint64_t immValue;
  uint32_t indexId;
  int64_t offset;
  uint32_t baseId;
  RegType indexType;
  RegType baseType;
  uint32_t memSize;
  Mem *m;
  uint32_t regId;
  RegType regType;
  RegMask regMask;
  OpFlags opFlags;
  Operand_ *op;
  Mem *memOp;
  uint32_t combinedRegMask;
  OpFlags combinedOpFlags;
  OpSignature oSigTranslated [6];
  InstOptions kAvx512Options;
  InstOptions kXAcqXRel;
  InstOptions kRepAny;
  InstFlags iFlags;
  CommonInfo *commonInfo;
  InstInfo *instInfo;
  InstOptions options;
  InstId instId;
  X86ValidationData *vd;
  uint32_t i;
  size_t in_stack_fffffffffffff538;
  undefined4 in_stack_fffffffffffff540;
  undefined1 in_stack_fffffffffffff544;
  byte bVar10;
  undefined1 in_stack_fffffffffffff545;
  undefined1 in_stack_fffffffffffff546;
  undefined1 in_stack_fffffffffffff547;
  bool *in_stack_fffffffffffff548;
  undefined3 uVar11;
  uint in_stack_fffffffffffff550;
  uint32_t in_stack_fffffffffffff554;
  OpSignature *in_stack_fffffffffffff558;
  bool local_a9a;
  bool local_a93;
  bool local_a92;
  ulong local_a90;
  uint local_a80;
  bool local_a7a;
  bool local_a79;
  byte local_a6d;
  byte local_a6c;
  bool local_a6b;
  byte local_a69;
  uint local_a4c;
  uint local_a40;
  undefined1 *local_a38;
  InstSignature *local_a28;
  ulong local_a10;
  uint local_a04;
  ulong local_a00;
  uint local_9f4;
  byte local_9ee;
  byte local_9ed;
  uint local_9ec;
  Operand_ *local_9e8;
  uint local_9dc;
  byte local_9d5;
  uint local_9d4;
  OpFlags local_9d0;
  Operand_ *local_9c8;
  Operand_ *local_9c0;
  uint local_9b4;
  OpFlags local_9b0;
  OpSignature local_9a8 [6];
  undefined4 local_978;
  undefined4 local_974;
  undefined4 local_970;
  InstFlags local_96c;
  uint *local_968;
  InstInfo *local_960;
  InstOptions local_958;
  uint local_954;
  undefined1 *local_950;
  uint local_948;
  uint local_944;
  ulong local_940;
  Operand_ *local_938;
  uint *local_930;
  Mode local_921;
  uint local_91c;
  Operand_ *local_910;
  Operand_ *local_908;
  uint *local_900;
  uint *local_8f8;
  uint *local_8f0;
  Operand_ *local_8e8;
  undefined4 local_8dc;
  uint *local_8d8;
  Operand_ *local_8d0;
  Operand_ *local_8c8;
  Operand_ *local_8c0;
  uint *local_8b0;
  InstInfo *local_8a8;
  undefined4 local_8a0;
  undefined4 local_89c;
  undefined4 local_898;
  undefined4 local_894;
  InstInfo *local_890;
  InstInfo *local_888;
  undefined4 local_880;
  InstOptions local_87c;
  undefined4 local_878;
  InstOptions local_874;
  Operand_ *local_870;
  Operand_ *local_868;
  Operand_ *local_860;
  uint local_858;
  uint local_854;
  undefined4 local_850;
  uint local_84c;
  undefined4 local_848;
  uint local_844;
  undefined4 local_840;
  uint local_83c;
  Operand_ *local_838;
  Operand_ *local_830;
  Operand_ *local_828;
  Operand_ *local_820;
  Operand_ *local_818;
  Operand_ *local_810;
  uint *local_808;
  uint *local_800;
  uint *local_7f8;
  uint *local_7f0;
  Operand_ *local_7e8;
  undefined1 local_7da;
  byte local_7d9;
  Operand_ *local_7d8;
  Operand_ *local_7d0;
  byte local_7c5;
  uint local_7c4;
  byte local_7bd;
  uint local_7bc;
  Operand_ *local_7b8;
  OpFlags local_7b0;
  OpFlags *local_7a8;
  undefined8 local_7a0;
  OpFlags *local_798;
  undefined8 local_790;
  OpFlags *local_788;
  undefined8 local_780;
  OpFlags *local_778;
  undefined8 local_770;
  OpFlags *local_768;
  undefined8 local_760;
  OpFlags *local_758;
  undefined8 local_750;
  OpFlags *local_748;
  undefined8 local_740;
  OpFlags *local_738;
  undefined8 local_730;
  OpFlags *local_728;
  undefined8 local_720;
  OpFlags *local_718;
  undefined8 local_710;
  OpFlags *local_708;
  undefined8 local_700;
  OpFlags *local_6f8;
  undefined8 local_6f0;
  OpFlags *local_6e8;
  undefined8 local_6e0;
  OpFlags *local_6d8;
  char *in_stack_fffffffffffff930;
  OpFlags *in_stack_fffffffffffff938;
  int line;
  char *in_stack_fffffffffffff940;
  undefined8 local_688;
  undefined8 local_680;
  ulong local_678;
  ulong local_670;
  ulong local_668;
  ulong local_660;
  undefined8 local_658;
  undefined8 local_650;
  undefined8 local_648;
  undefined8 local_640;
  undefined8 local_638;
  undefined8 local_630;
  undefined8 local_628;
  undefined8 local_620;
  undefined8 local_618;
  undefined8 local_610;
  undefined8 local_608;
  undefined8 local_600;
  undefined8 local_5f8;
  undefined8 local_5f0;
  undefined8 local_5e8;
  undefined8 local_5e0;
  undefined8 local_5d8;
  undefined8 local_5d0;
  undefined8 local_5c8;
  undefined8 local_5c0;
  undefined8 local_5b8;
  undefined8 local_5b0;
  undefined8 local_5a8;
  undefined8 local_5a0;
  undefined8 local_598;
  undefined8 local_590;
  undefined8 local_588;
  undefined8 local_580;
  undefined8 local_578;
  undefined8 local_570;
  undefined8 local_568;
  undefined8 local_560;
  undefined8 local_558;
  undefined8 local_550;
  undefined8 local_548;
  undefined8 local_540;
  undefined8 local_538;
  undefined8 local_530;
  undefined8 local_528;
  undefined8 local_520;
  undefined8 local_518;
  undefined8 local_510;
  undefined8 local_508;
  undefined8 local_500;
  undefined8 local_4f8;
  undefined8 local_4f0;
  undefined8 local_4e8;
  undefined8 local_4e0;
  undefined8 local_4d8;
  undefined8 local_4d0;
  undefined8 local_4c8;
  undefined8 local_4c0;
  undefined8 local_4b8;
  undefined8 local_4b0;
  undefined8 local_4a8;
  undefined8 local_4a0;
  undefined8 local_498;
  undefined8 local_490;
  undefined8 local_488;
  undefined8 local_480;
  undefined8 local_478;
  undefined8 local_470;
  undefined8 local_468;
  undefined8 local_460;
  undefined8 local_458;
  undefined8 local_450;
  undefined8 local_448;
  undefined8 local_440;
  undefined8 local_438;
  undefined8 local_430;
  undefined8 local_428;
  undefined8 local_420;
  undefined8 local_418;
  undefined8 local_410;
  undefined8 local_408;
  undefined8 local_400;
  undefined8 local_3f8;
  undefined8 local_3f0;
  undefined8 local_3e8;
  undefined8 local_3e0;
  undefined8 local_3d8;
  undefined8 local_3d0;
  undefined8 local_3c8;
  undefined8 local_3c0;
  undefined8 local_3b8;
  undefined8 local_3b0;
  undefined8 local_3a8;
  undefined8 local_3a0;
  undefined8 local_398;
  undefined8 local_390;
  undefined8 local_388;
  undefined8 local_380;
  undefined8 local_378;
  undefined8 local_370;
  undefined8 local_368;
  undefined8 local_360;
  undefined8 local_358;
  undefined8 local_350;
  undefined8 local_348;
  undefined8 local_340;
  undefined8 local_338;
  undefined8 local_330;
  undefined8 local_328;
  undefined8 local_320;
  undefined8 local_318;
  undefined8 local_310;
  undefined8 local_308;
  undefined8 local_300;
  undefined8 local_2f8;
  undefined8 local_2f0;
  undefined8 local_2e8;
  undefined8 local_2e0;
  undefined8 local_2d8;
  undefined8 local_2d0;
  undefined8 local_2c8;
  undefined8 local_2c0;
  undefined8 local_2b8;
  undefined8 local_2b0;
  Operand_ *local_2a8;
  Operand_ *local_2a0;
  ulong *local_298;
  undefined4 local_28c;
  Operand_ *local_288;
  undefined4 local_27c;
  uint *local_278;
  undefined4 local_26c;
  uint *local_268;
  uint *local_260;
  uint *local_258;
  uint *local_250;
  uint *local_248;
  uint *local_240;
  uint *local_238;
  uint *local_230;
  uint *local_228;
  uint *local_220;
  uint *local_218;
  uint *local_210;
  InstFlags *local_208;
  uint *local_200;
  uint *local_1f8;
  Operand_ *local_1f0;
  Operand_ *local_1e8;
  uint *local_1e0;
  uint *local_1d8;
  uint *local_1d0;
  Operand_ *local_1c8;
  Operand_ *local_1c0;
  Operand_ *local_1b8;
  Operand_ *local_1b0;
  Operand_ *local_1a8;
  Operand_ *local_1a0;
  Operand_ *local_198;
  Operand_ *local_190;
  Operand_ *local_188;
  Operand_ *local_180;
  Operand_ *local_178;
  undefined4 local_16c;
  uint *local_168;
  undefined4 local_15c;
  uint *local_158;
  undefined4 local_14c;
  uint *local_148;
  undefined4 local_13c;
  uint *local_138;
  undefined4 local_12c;
  uint *local_128;
  undefined4 local_11c;
  uint *local_118;
  undefined4 local_10c;
  uint *local_108;
  undefined4 local_fc;
  uint *local_f8;
  undefined4 local_ec;
  uint *local_e8;
  uint *local_e0;
  uint *local_d8;
  uint *local_d0;
  Operand_ *local_c8;
  Operand_ *local_c0;
  byte *local_b8;
  byte *local_b0;
  undefined8 *local_a8;
  undefined8 *local_a0;
  ulong *local_98;
  ulong local_90;
  Operand_ *local_88;
  ulong local_80;
  undefined8 local_78;
  undefined8 *local_70;
  undefined4 *local_68;
  Operand_ *local_60;
  undefined4 local_54;
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  uint *local_38;
  Operand_ *local_30;
  Operand_ *local_28;
  Operand_ *local_20;
  Operand_ *local_18;
  Operand_ *local_10;
  Operand_ *local_8;
  
  local_950 = _x64ValidationData;
  if (in_DIL == kX86) {
    local_950 = _x86ValidationData;
  }
  local_954 = *in_RSI;
  local_958 = in_RSI[1];
  local_91c = local_954;
  if (0x6ba < local_954) {
    EVar4 = DebugUtils::errored(0x1a);
    return EVar4;
  }
  local_944 = in_R8D;
  local_940 = in_RCX;
  local_938 = in_RDX;
  local_930 = in_RSI;
  local_921 = in_DIL;
  local_960 = InstDB::infoById(0x1d8ea2);
  local_968 = (uint *)(InstDB::_commonInfoTable + (ulong)(*(uint *)local_960 >> 0xe & 0x3ff) * 8);
  local_208 = (InstFlags *)
              (InstDB::_commonInfoTable + (ulong)(*(uint *)local_960 >> 0xe & 0x3ff) * 8);
  local_96c = *local_208;
  local_970 = 0xc000;
  local_974 = 0x30000;
  local_978 = 0x8c0000;
  local_894 = 0x2000;
  local_898 = 0x30000;
  local_8a8 = local_960;
  local_890 = local_960;
  local_888 = local_960;
  bVar3 = Support::test<asmjit::v1_14::InstOptions,asmjit::v1_14::InstOptions>
                    (local_958,kX86_XRelease|kX86_XAcquire|kX86_Lock);
  if (bVar3) {
    bVar3 = Support::test<asmjit::v1_14::InstOptions,asmjit::v1_14::InstOptions>
                      (local_958,kX86_Lock);
    if (bVar3) {
      bVar3 = Support::
              test<asmjit::v1_14::x86::InstDB::InstFlags,asmjit::v1_14::x86::InstDB::InstFlags>
                        (local_96c,kLock);
      local_a69 = 0;
      if (!bVar3) {
        bVar3 = Support::test<asmjit::v1_14::InstOptions,asmjit::v1_14::InstOptions>
                          (local_958,kX86_XRelease|kX86_XAcquire);
        local_a69 = bVar3 ^ 0xff;
      }
      if ((local_a69 & 1) != 0) {
        EVar4 = DebugUtils::errored(0x21);
        return EVar4;
      }
      bVar3 = true;
      if (local_940 != 0) {
        local_8c8 = local_938;
        local_8c0 = local_938;
        local_30 = local_938;
        local_8 = local_938;
        bVar3 = ((local_938->_signature)._bits & 7) != 2;
      }
      if (bVar3) {
        EVar4 = DebugUtils::errored(0x21);
        return EVar4;
      }
    }
    bVar3 = Support::test<asmjit::v1_14::InstOptions,asmjit::v1_14::InstOptions>
                      (local_958,kX86_XRelease|kX86_XAcquire);
    if (bVar3) {
      bVar3 = Support::test<asmjit::v1_14::InstOptions,asmjit::v1_14::InstOptions>
                        (local_958,kX86_Lock);
      if (bVar3) {
        local_874 = local_958;
        local_878 = 0x30000;
      }
      local_a6b = !bVar3 || (local_958 & (kX86_XRelease|kX86_XAcquire)) ==
                            (kX86_XRelease|kX86_XAcquire);
      if (local_a6b) {
        EVar4 = DebugUtils::errored(0x20);
        return EVar4;
      }
      bVar3 = Support::test<asmjit::v1_14::InstOptions,asmjit::v1_14::InstOptions>
                        (local_958,kX86_XAcquire);
      local_a6c = 0;
      if (bVar3) {
        bVar3 = Support::
                test<asmjit::v1_14::x86::InstDB::InstFlags,asmjit::v1_14::x86::InstDB::InstFlags>
                          (local_96c,kXAcquire);
        local_a6c = bVar3 ^ 0xff;
      }
      if ((local_a6c & 1) != 0) {
        EVar4 = DebugUtils::errored(0x22);
        return EVar4;
      }
      bVar3 = Support::test<asmjit::v1_14::InstOptions,asmjit::v1_14::InstOptions>
                        (local_958,kX86_XRelease);
      local_a6d = 0;
      if (bVar3) {
        bVar3 = Support::
                test<asmjit::v1_14::x86::InstDB::InstFlags,asmjit::v1_14::x86::InstDB::InstFlags>
                          (local_96c,kXRelease);
        local_a6d = bVar3 ^ 0xff;
      }
      if ((local_a6d & 1) != 0) {
        EVar4 = DebugUtils::errored(0x23);
        return EVar4;
      }
    }
  }
  bVar3 = Support::test<asmjit::v1_14::InstOptions,asmjit::v1_14::InstOptions>
                    (local_958,kX86_Repne|kX86_Rep);
  if (bVar3) {
    local_87c = local_958;
    local_880 = 0xc000;
    if ((local_958 & (kX86_Repne|kX86_Rep)) == (kX86_Repne|kX86_Rep)) {
      EVar4 = DebugUtils::errored(0x20);
      return EVar4;
    }
    bVar3 = Support::
            test<asmjit::v1_14::x86::InstDB::InstFlags,asmjit::v1_14::x86::InstDB::InstFlags>
                      (local_96c,kRep);
    if (((bVar3 ^ 0xffU) & 1) != 0) {
      EVar4 = DebugUtils::errored(0x24);
      return EVar4;
    }
  }
  local_9b0 = kNone;
  local_9b4 = 0;
  local_9c0 = (Operand_ *)0x0;
  local_948 = 0;
  while ((local_948 < local_940 &&
         (local_9c8 = local_938 + local_948, local_908 = local_9c8, local_28 = local_9c8,
         local_10 = local_9c8, ((local_9c8->_signature)._bits & 7) != 0))) {
    local_9d0 = kNone;
    local_9d4 = 0;
    local_910 = local_9c8;
    local_20 = local_9c8;
    local_18 = local_9c8;
    switch((local_9c8->_signature)._bits & 7) {
    case 1:
      local_9d5 = (byte)((local_9c8->_signature)._bits >> 3) & 0x1f;
      local_9d0 = *(OpFlags *)(_x86OpFlagFromRegType + (ulong)local_9d5 * 8);
      local_870 = local_9c8;
      local_868 = local_9c8;
      local_1f0 = local_9c8;
      local_1e8 = local_9c8;
      if (local_9d0 == kNone) {
        EVar4 = DebugUtils::errored(0x1b);
        return EVar4;
      }
      local_9dc = local_9c8->_baseId;
      local_860 = local_9c8;
      if (local_9dc < 0x100) {
        if (0x1f < local_9dc) {
          EVar4 = DebugUtils::errored(0x1d);
          return EVar4;
        }
        local_854 = *(uint *)(local_950 + (ulong)local_9d5 * 4);
        local_1d0 = &local_858;
        local_858 = local_9dc;
        if ((local_854 & 1 << ((byte)local_9dc & 0x1f)) == 0) {
          EVar4 = DebugUtils::errored(0x1d);
          return EVar4;
        }
        local_8f0 = &local_9dc;
        local_9d4 = 1 << ((byte)local_9dc & 0x1f);
        local_9b4 = local_9d4 | local_9b4;
        local_e0 = local_8f0;
      }
      else {
        local_83c = local_944;
        local_840 = 1;
        if ((local_944 & 1) == 0) {
          EVar4 = DebugUtils::errored(0x3e);
          return EVar4;
        }
        local_9d4 = 0xffffffff;
      }
      break;
    case 2:
      local_9ec = (local_9c8->_signature)._bits >> 0x18;
      local_9ed = (byte)((local_9c8->_signature)._bits >> 3) & 0x1f;
      local_9ee = (byte)((local_9c8->_signature)._bits >> 8) & 0x1f;
      local_9e8 = local_9c8;
      local_9c0 = local_9c8;
      local_8e8 = local_9c8;
      local_838 = local_9c8;
      local_828 = local_9c8;
      local_820 = local_9c8;
      local_818 = local_9c8;
      local_1c8 = local_9c8;
      local_1b0 = local_9c8;
      local_1a8 = local_9c8;
      local_190 = local_9c8;
      local_188 = local_9c8;
      local_180 = local_9c8;
      if (6 < ((local_9c8->_signature)._bits >> 0x12 & 7)) {
        EVar4 = DebugUtils::errored(0x31);
        return EVar4;
      }
      local_810 = local_9c8;
      local_178 = local_9c8;
      if (((local_9c8->_signature)._bits & 0xe00000) != 0) {
        if (local_9ec == 0) {
          local_7f8 = local_968;
          local_108 = local_968;
          local_10c = 0x40;
          bVar3 = Support::test<unsigned_int,asmjit::v1_14::x86::InstDB::Avx512Flags>
                            (local_968[1] & 0x7ff,kB64);
          if (bVar3) {
            local_a80 = 8;
          }
          else {
            local_808 = local_968;
            local_e8 = local_968;
            local_ec = 0x20;
            bVar3 = Support::test<unsigned_int,asmjit::v1_14::x86::InstDB::Avx512Flags>
                              (local_968[1] & 0x7ff,kB32);
            local_a80 = 2;
            if (bVar3) {
              local_a80 = 4;
            }
          }
          local_9ec = local_a80;
        }
        else {
          local_800 = local_968;
          local_f8 = local_968;
          local_fc = 0x20;
          local_a79 = Support::test<unsigned_int,asmjit::v1_14::x86::InstDB::Avx512Flags>
                                (local_968[1] & 0x7ff,kB32);
          local_a79 = local_a79 && local_9ec != 4;
          if (local_a79) {
            EVar4 = DebugUtils::errored(0x29);
            return EVar4;
          }
          local_7f0 = local_968;
          local_118 = local_968;
          local_11c = 0x40;
          local_a7a = Support::test<unsigned_int,asmjit::v1_14::x86::InstDB::Avx512Flags>
                                (local_968[1] & 0x7ff,kB64);
          local_a7a = local_a7a && local_9ec != 8;
          if (local_a7a) {
            EVar4 = DebugUtils::errored(0x29);
            return EVar4;
          }
        }
        local_7e8 = local_9e8;
        local_c8 = local_9e8;
        local_9ec = local_9ec << ((byte)((local_9e8->_signature)._bits >> 0x15) & 7);
      }
      if (local_9ed == 0) {
LAB_001d9bb7:
        if (local_9ed != 1) {
          local_1c0 = local_9e8;
          local_1b8 = local_9e8;
          if (((local_9e8->_signature)._bits >> 3 & 0x1f) == 0) {
            local_a90 = CONCAT44(local_9e8->_baseId,local_9e8->_data[1]);
          }
          else {
            local_a90 = (ulong)(int)local_9e8->_data[1];
          }
          local_a00 = local_a90;
          local_670 = local_a90;
          local_678 = local_a90;
          local_680 = 0xffffffff80000000;
          local_688 = 0x7fffffff;
          local_98 = &local_678;
          local_a0 = &local_680;
          local_a8 = &local_688;
          if ((long)local_a90 < -0x80000000 || 0x7fffffff < (long)local_a90) {
            if (local_921 == kX86) {
              local_660 = local_a90;
              local_a92 = 0xffffffff < local_a90;
              if (local_a92) {
                EVar4 = DebugUtils::errored(0x2e);
                return EVar4;
              }
            }
            else if (local_9ee != 0) {
              local_668 = local_a90;
              local_a93 = 0xffffffff < local_a90;
              if (local_a93) {
                EVar4 = DebugUtils::errored(0x2e);
                return EVar4;
              }
              if (local_9ee != 6) {
                EVar4 = DebugUtils::errored(0x2f);
                return EVar4;
              }
            }
          }
        }
      }
      else {
        local_7d9 = local_9ed;
        local_7da = 1;
        if (local_9ed < 2) goto LAB_001d9bb7;
        local_7d8 = local_9e8;
        local_9f4 = local_9e8->_baseId;
        local_7d0 = local_9e8;
        local_c0 = local_9e8;
        if (((local_9e8->_signature)._bits & 0x2000) == 0) {
          local_7bc = *(uint *)(local_950 + 0x80);
          local_7bd = local_9ed;
          local_b8 = &local_7bd;
          if ((local_7bc & 1 << (local_9ed & 0x1f)) == 0) {
            EVar4 = DebugUtils::errored(0x2b);
            return EVar4;
          }
        }
        if (local_9f4 < 0x100) {
          if (0x1f < local_9f4) {
            EVar4 = DebugUtils::errored(0x1d);
            return EVar4;
          }
          local_8f8 = &local_9f4;
          local_9d4 = 1 << ((byte)local_9f4 & 0x1f);
          local_9b4 = local_9d4 | local_9b4;
          local_d8 = local_8f8;
        }
        else {
          local_844 = local_944;
          local_848 = 1;
          if ((local_944 & 1) == 0) {
            EVar4 = DebugUtils::errored(0x3e);
            return EVar4;
          }
          local_9d4 = 0xffffffff;
        }
        if ((local_9ee == 0) && (local_7b8 = local_9e8, local_9e8->_data[1] == 0)) {
          local_9d0 = local_9d0 | kFlagMemBase;
        }
      }
      if (local_9ee != 0) {
        local_7c4 = *(uint *)(local_950 + 0x84);
        local_7c5 = local_9ee;
        local_b0 = &local_7c5;
        if ((local_7c4 & 1 << (local_9ee & 0x1f)) == 0) {
          EVar4 = DebugUtils::errored(0x2b);
          return EVar4;
        }
        if (local_9ee == 0xc) {
          local_2b0 = 0x40000000;
          local_2b8 = 0x200000000;
          in_stack_fffffffffffff940 = (char *)0x240000000;
          local_9d0 = local_9d0 | (kVm64x|kVm32x);
        }
        else if (local_9ee == 0xd) {
          local_2c0 = 0x80000000;
          local_2c8 = 0x400000000;
          in_stack_fffffffffffff930 = (char *)0x480000000;
          in_stack_fffffffffffff938 = &local_9d0;
          local_9d0 = local_9d0 | (kVm64y|kVm32y);
        }
        else if (local_9ee == 0xe) {
          local_2d0 = 0x100000000;
          local_2d8 = 0x800000000;
          local_6e0 = 0x900000000;
          local_6d8 = &local_9d0;
          local_9d0 = local_9d0 | (kVm64z|kVm32z);
        }
        else if (local_9ed != 0) {
          local_6e8 = &local_9d0;
          local_6f0 = 0x8000000000000;
          local_9d0 = local_9d0 | kFlagMib;
        }
        if ((local_9ed == 2) &&
           (bVar3 = Support::
                    test<asmjit::v1_14::x86::InstDB::OpFlags,asmjit::v1_14::x86::InstDB::OpFlags>
                              (local_9d0,kVmMask), bVar3)) {
          EVar4 = DebugUtils::errored(0x2b);
          return EVar4;
        }
        local_2a8 = local_9e8;
        local_a04 = local_9e8->_data[0];
        if (local_a04 < 0x100) {
          if (0x1f < local_a04) {
            EVar4 = DebugUtils::errored(0x1d);
            return EVar4;
          }
          local_900 = &local_a04;
          local_9b4 = 1 << ((byte)local_a04 & 0x1f) | local_9b4;
          local_d0 = local_900;
        }
        else {
          local_84c = local_944;
          local_850 = 1;
          if ((local_944 & 1) == 0) {
            EVar4 = DebugUtils::errored(0x3e);
            return EVar4;
          }
        }
        local_9d4 = 0;
      }
      if (local_9ec == 0) {
        local_6f8 = &local_9d0;
        local_700 = 0x40000;
        local_9d0 = local_9d0 | kMemUnspecified;
      }
      else if (local_9ec == 1) {
        local_708 = &local_9d0;
        local_710 = 0x80000;
        local_9d0 = local_9d0 | kMem8;
      }
      else if (local_9ec == 2) {
        local_718 = &local_9d0;
        local_720 = 0x100000;
        local_9d0 = local_9d0 | kMem16;
      }
      else if (local_9ec == 4) {
        local_728 = &local_9d0;
        local_730 = 0x200000;
        local_9d0 = local_9d0 | kMem32;
      }
      else if (local_9ec == 6) {
        local_738 = &local_9d0;
        local_740 = 0x400000;
        local_9d0 = local_9d0 | kMem48;
      }
      else if (local_9ec == 8) {
        local_748 = &local_9d0;
        local_750 = 0x800000;
        local_9d0 = local_9d0 | kMem64;
      }
      else if (local_9ec == 10) {
        local_758 = &local_9d0;
        local_760 = 0x1000000;
        local_9d0 = local_9d0 | kMem80;
      }
      else if (local_9ec == 0x10) {
        local_768 = &local_9d0;
        local_770 = 0x2000000;
        local_9d0 = local_9d0 | kMem128;
      }
      else if (local_9ec == 0x20) {
        local_778 = &local_9d0;
        local_780 = 0x4000000;
        local_9d0 = local_9d0 | kMem256;
      }
      else {
        if (local_9ec != 0x40) {
          EVar4 = DebugUtils::errored(0x33);
          return EVar4;
        }
        local_788 = &local_9d0;
        local_790 = 0x8000000;
        local_9d0 = local_9d0 | kMem512;
      }
      break;
    default:
      EVar4 = DebugUtils::errored(3);
      return EVar4;
    case 4:
      local_90 = *(ulong *)local_9c8->_data;
      local_78 = 1;
      local_70 = &local_78;
      local_8d0 = local_9c8;
      local_2a0 = local_9c8;
      local_88 = local_9c8;
      local_80 = local_90;
      if ((long)local_90 < 0) {
        local_298 = &local_a10;
        local_a10 = -local_90;
        if (local_a10 < 9) {
          local_5b0 = 0x100000000000;
          local_5b8 = 0x40000000000;
          local_5c0 = 0x140000000000;
          local_5c8 = 0x10000000000;
          local_5d0 = 0x150000000000;
          local_5d8 = 0x4000000000;
          local_5e0 = 0x154000000000;
          local_5e8 = 0x1000000000;
          local_9d0 = kImmI64|kImmI32|kImmI16|kImmI8|kImmI4;
        }
        else if (local_a10 < 0x81) {
          local_5f0 = 0x100000000000;
          local_5f8 = 0x40000000000;
          local_600 = 0x140000000000;
          local_608 = 0x10000000000;
          local_610 = 0x150000000000;
          local_618 = 0x4000000000;
          local_9d0 = kImmI64|kImmI32|kImmI16|kImmI8;
        }
        else if (local_a10 < 0x8001) {
          local_620 = 0x100000000000;
          local_628 = 0x40000000000;
          local_630 = 0x140000000000;
          local_638 = 0x10000000000;
          local_9d0 = kImmI64|kImmI32|kImmI16;
        }
        else if (local_a10 < 0x80000001) {
          local_640 = 0x100000000000;
          local_648 = 0x40000000000;
          local_9d0 = kImmI64|kImmI32;
        }
        else {
          local_9d0 = kImmI64;
        }
      }
      else {
        local_a10 = local_90;
        if (local_90 < 8) {
          local_2e0 = 0x100000000000;
          local_2e8 = 0x200000000000;
          local_2f0 = 0x300000000000;
          local_2f8 = 0x40000000000;
          local_300 = 0x340000000000;
          local_308 = 0x80000000000;
          local_310 = 0x3c0000000000;
          local_318 = 0x10000000000;
          local_320 = 0x3d0000000000;
          local_328 = 0x20000000000;
          local_330 = 0x3f0000000000;
          local_338 = 0x4000000000;
          local_340 = 0x3f4000000000;
          local_348 = 0x8000000000;
          local_350 = 0x3fc000000000;
          local_358 = 0x1000000000;
          local_360 = 0x3fd000000000;
          local_368 = 0x2000000000;
          local_9d0 = kImmMask;
        }
        else if (local_90 < 0x10) {
          local_370 = 0x100000000000;
          local_378 = 0x200000000000;
          local_380 = 0x300000000000;
          local_388 = 0x40000000000;
          local_390 = 0x340000000000;
          local_398 = 0x80000000000;
          local_3a0 = 0x3c0000000000;
          local_3a8 = 0x10000000000;
          local_3b0 = 0x3d0000000000;
          local_3b8 = 0x20000000000;
          local_3c0 = 0x3f0000000000;
          local_3c8 = 0x4000000000;
          local_3d0 = 0x3f4000000000;
          local_3d8 = 0x8000000000;
          local_3e0 = 0x3fc000000000;
          local_3e8 = 0x2000000000;
          local_9d0 = kImmU64|kImmI64|kImmU32|kImmI32|kImmU16|kImmI16|kImmU8|kImmI8|kImmU4;
        }
        else if (local_90 < 0x80) {
          local_3f0 = 0x100000000000;
          local_3f8 = 0x200000000000;
          local_400 = 0x300000000000;
          local_408 = 0x40000000000;
          local_410 = 0x340000000000;
          local_418 = 0x80000000000;
          local_420 = 0x3c0000000000;
          local_428 = 0x10000000000;
          local_430 = 0x3d0000000000;
          local_438 = 0x20000000000;
          local_440 = 0x3f0000000000;
          local_448 = 0x4000000000;
          local_450 = 0x3f4000000000;
          local_458 = 0x8000000000;
          local_9d0 = kImmU64|kImmI64|kImmU32|kImmI32|kImmU16|kImmI16|kImmU8|kImmI8;
        }
        else if (local_90 < 0x100) {
          local_460 = 0x100000000000;
          local_468 = 0x200000000000;
          local_470 = 0x300000000000;
          local_478 = 0x40000000000;
          local_480 = 0x340000000000;
          local_488 = 0x80000000000;
          local_490 = 0x3c0000000000;
          local_498 = 0x10000000000;
          local_4a0 = 0x3d0000000000;
          local_4a8 = 0x20000000000;
          local_4b0 = 0x3f0000000000;
          local_4b8 = 0x8000000000;
          local_9d0 = kImmU64|kImmI64|kImmU32|kImmI32|kImmU16|kImmI16|kImmU8;
        }
        else if (local_90 < 0x8000) {
          local_4c0 = 0x100000000000;
          local_4c8 = 0x200000000000;
          local_4d0 = 0x300000000000;
          local_4d8 = 0x40000000000;
          local_4e0 = 0x340000000000;
          local_4e8 = 0x80000000000;
          local_4f0 = 0x3c0000000000;
          local_4f8 = 0x10000000000;
          local_500 = 0x3d0000000000;
          local_508 = 0x20000000000;
          local_9d0 = kImmU64|kImmI64|kImmU32|kImmI32|kImmU16|kImmI16;
        }
        else if (local_90 < 0x10000) {
          local_510 = 0x100000000000;
          local_518 = 0x200000000000;
          local_520 = 0x300000000000;
          local_528 = 0x40000000000;
          local_530 = 0x340000000000;
          local_538 = 0x80000000000;
          local_540 = 0x3c0000000000;
          local_548 = 0x20000000000;
          local_9d0 = kImmU64|kImmI64|kImmU32|kImmI32|kImmU16;
        }
        else if (local_90 < 0x80000000) {
          local_550 = 0x100000000000;
          local_558 = 0x200000000000;
          local_560 = 0x300000000000;
          local_568 = 0x40000000000;
          local_570 = 0x340000000000;
          local_578 = 0x80000000000;
          local_9d0 = kImmU64|kImmI64|kImmU32|kImmI32;
        }
        else if (local_90 < 0x100000000) {
          local_580 = 0x100000000000;
          local_588 = 0x200000000000;
          local_590 = 0x300000000000;
          local_598 = 0x80000000000;
          local_9d0 = kImmU64|kImmI64|kImmU32;
        }
        else if (local_90 < 0x8000000000000000) {
          local_5a0 = 0x100000000000;
          local_5a8 = 0x200000000000;
          local_9d0 = kImmU64|kImmI64;
        }
        else {
          local_9d0 = kImmU64;
        }
      }
      break;
    case 5:
      local_650 = 0x400000000000;
      local_658 = 0x800000000000;
      local_7a0 = 0xc00000000000;
      local_798 = &local_9d0;
      local_9d0 = kRelMask;
    }
    pOVar7 = local_9a8 + local_948;
    *pOVar7 = (OpSignature)((ulong)*pOVar7 & 0xff00000000000000 | local_9d0 & 0xffffffffffffff);
    *pOVar7 = (OpSignature)((ulong)*pOVar7 & 0xffffffffffffff | (ulong)(local_9d4 & 0xff) << 0x38);
    local_7a8 = &local_9b0;
    local_7b0 = local_9d0;
    local_9b0 = local_9b0 | local_9d0;
    local_948 = local_948 + 1;
  }
  uVar1 = local_28c;
  uVar2 = local_50;
  if (local_948 < local_940) {
    while (local_50 = uVar2, local_28c = uVar1, local_940 = local_940 - 1, local_948 < local_940) {
      local_288 = local_938 + local_940;
      local_54 = 0;
      local_50 = 0;
      local_28c = 0;
      local_68 = &local_28c;
      uVar1 = 0;
      local_60 = local_288;
      uVar2 = 0;
      if ((local_288->_signature)._bits != 0) {
        EVar4 = DebugUtils::errored(0x1a);
        return EVar4;
      }
    }
  }
  if (local_921 == kX86) {
    bVar3 = Support::test<asmjit::v1_14::x86::InstDB::OpFlags,asmjit::v1_14::x86::InstDB::OpFlags>
                      (local_9b0,kRegGpq);
    if (bVar3) {
      EVar4 = DebugUtils::errored(0x3a);
      return EVar4;
    }
  }
  else {
    local_8d8 = local_930;
    local_8dc = 0x40000000;
    bVar3 = Support::test<asmjit::v1_14::InstOptions,asmjit::v1_14::InstOptions>
                      (local_930[1],kX86_Rex);
    local_a9a = false;
    if (bVar3 || (local_9b4 & 0xffffff00) != 0) {
      local_a9a = Support::
                  test<asmjit::v1_14::x86::InstDB::OpFlags,asmjit::v1_14::x86::InstDB::OpFlags>
                            (local_9b0,kRegGpbHi);
    }
    if (local_a9a != false) {
      EVar4 = DebugUtils::errored(0x39);
      return EVar4;
    }
  }
  line = (int)((ulong)in_stack_fffffffffffff938 >> 0x20);
  local_a28 = (InstSignature *)
              (InstDB::_instSignatureTable + (long)(int)(local_968[1] >> 0xb & 0x7ff) * 8);
  pIVar8 = local_a28 + (int)(local_968[1] >> 0x16 & 0x1f);
  if (local_a28 != pIVar8) {
    local_a38 = InstDB::_opSignatureTable;
    do {
      bVar3 = InstDB::InstSignature::supportsMode(local_a28,local_921);
      if (bVar3) {
        local_a40 = 0;
        uVar5 = InstDB::InstSignature::opCount(local_a28);
        if (uVar5 == local_940) {
          for (local_a40 = 0; local_a40 < local_940; local_a40 = local_a40 + 1) {
            in_stack_fffffffffffff558 = local_9a8 + local_a40;
            InstDB::InstSignature::opSignature
                      ((InstSignature *)
                       CONCAT17(in_stack_fffffffffffff547,
                                CONCAT16(in_stack_fffffffffffff546,
                                         CONCAT15(in_stack_fffffffffffff545,
                                                  CONCAT14(in_stack_fffffffffffff544,
                                                           in_stack_fffffffffffff540)))),
                       in_stack_fffffffffffff538);
            bVar3 = x86CheckOSig(in_stack_fffffffffffff558,
                                 (OpSignature *)
                                 CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550),
                                 in_stack_fffffffffffff548);
            if (!bVar3) break;
          }
        }
        else {
          in_stack_fffffffffffff554 = uVar5;
          uVar6 = InstDB::InstSignature::implicitOpCount(local_a28);
          if (in_stack_fffffffffffff554 - uVar6 == local_940) {
            local_a4c = 0;
            local_a40 = 0;
            while( true ) {
              uVar11 = (undefined3)in_stack_fffffffffffff550;
              in_stack_fffffffffffff550 = in_stack_fffffffffffff550 & 0xffffff;
              if (local_a40 < local_940) {
                in_stack_fffffffffffff550 = CONCAT13(local_a4c < uVar5,uVar11);
              }
              if ((char)(in_stack_fffffffffffff550 >> 0x18) == '\0') break;
              while( true ) {
                in_stack_fffffffffffff548 = (bool *)local_a38;
                InstDB::InstSignature::opSignatureIndex
                          ((InstSignature *)
                           CONCAT17(in_stack_fffffffffffff547,
                                    CONCAT16(in_stack_fffffffffffff546,
                                             CONCAT15(in_stack_fffffffffffff545,
                                                      CONCAT14(in_stack_fffffffffffff544,
                                                               in_stack_fffffffffffff540)))),
                           in_stack_fffffffffffff538);
                bVar3 = InstDB::OpSignature::isImplicit((OpSignature *)0x1db607);
                if (!bVar3) break;
                local_a4c = local_a4c + 1;
                if (uVar5 <= local_a4c) goto LAB_001db669;
              }
              bVar3 = x86CheckOSig(in_stack_fffffffffffff558,
                                   (OpSignature *)
                                   CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550),
                                   in_stack_fffffffffffff548);
              if (!bVar3) break;
              local_a40 = local_a40 + 1;
              local_a4c = local_a4c + 1;
            }
          }
        }
LAB_001db669:
        line = (int)((ulong)in_stack_fffffffffffff938 >> 0x20);
        if (local_a40 == local_940) break;
      }
      line = (int)((ulong)in_stack_fffffffffffff938 >> 0x20);
      local_a28 = local_a28 + 1;
    } while (local_a28 != pIVar8);
    if (local_a28 == pIVar8) {
      EVar4 = DebugUtils::errored(0x1a);
      return EVar4;
    }
  }
  local_8b0 = local_930;
  puVar9 = local_930 + 2;
  bVar3 = Support::test<asmjit::v1_14::InstOptions,asmjit::v1_14::InstOptions>
                    (local_958,kX86_ZMask|kX86_SAE|kX86_ER);
  if (bVar3) {
    local_268 = local_968;
    local_26c = 0x800000;
    bVar3 = Support::test<unsigned_int,asmjit::v1_14::x86::InstDB::InstFlags>(*local_968,kEvex);
    if (bVar3) {
      bVar3 = Support::test<asmjit::v1_14::InstOptions,asmjit::v1_14::InstOptions>
                        (local_958,kX86_ZMask);
      if (bVar3) {
        bVar3 = Support::test<asmjit::v1_14::InstOptions,asmjit::v1_14::InstOptions>
                          (local_958,kX86_ZMask);
        bVar10 = 0;
        if (bVar3) {
          local_260 = local_968;
          local_128 = local_968;
          local_12c = 2;
          bVar3 = Support::test<unsigned_int,asmjit::v1_14::x86::InstDB::Avx512Flags>
                            (local_968[1] & 0x7ff,kZ);
          bVar10 = bVar3 ^ 0xff;
        }
        if ((bVar10 & 1) != 0) {
          EVar4 = DebugUtils::errored(0x28);
          return EVar4;
        }
      }
      local_89c = 0x80000;
      local_8a0 = 0x40000;
      bVar3 = Support::test<asmjit::v1_14::InstOptions,asmjit::v1_14::InstOptions>
                        (local_958,kX86_SAE|kX86_ER);
      if (bVar3) {
        if (local_9c0 != (Operand_ *)0x0) {
          EVar4 = DebugUtils::errored(0x2a);
          return EVar4;
        }
        bVar3 = Support::test<asmjit::v1_14::InstOptions,asmjit::v1_14::InstOptions>
                          (local_958,kX86_ER);
        if (bVar3) {
          local_258 = local_968;
          local_138 = local_968;
          local_13c = 4;
          bVar3 = Support::test<unsigned_int,asmjit::v1_14::x86::InstDB::Avx512Flags>
                            (local_968[1] & 0x7ff,kER);
          if (((bVar3 ^ 0xffU) & 1) != 0) {
            EVar4 = DebugUtils::errored(0x2a);
            return EVar4;
          }
        }
        else {
          local_250 = local_968;
          local_148 = local_968;
          local_14c = 8;
          bVar3 = Support::test<unsigned_int,asmjit::v1_14::x86::InstDB::Avx512Flags>
                            (local_968[1] & 0x7ff,kSAE);
          if (((bVar3 ^ 0xffU) & 1) != 0) {
            EVar4 = DebugUtils::errored(0x2a);
            return EVar4;
          }
        }
        local_248 = local_968;
        local_40 = 0x10;
        local_44 = 0x20;
        local_48 = 0x30;
        local_4c = 0x40;
        local_15c = 0x70;
        local_158 = local_968;
        bVar3 = Support::test<unsigned_int,asmjit::v1_14::x86::InstDB::Avx512Flags>
                          (local_968[1] & 0x7ff,kB64|kB32|kB16);
        if (bVar3) {
          if (local_940 < 2) {
            DebugUtils::assertionFailed(in_stack_fffffffffffff940,line,in_stack_fffffffffffff930);
          }
          bVar3 = x86IsZmmOrM512(local_938);
          bVar10 = 0;
          if (!bVar3) {
            bVar3 = x86IsZmmOrM512(local_938 + 1);
            bVar10 = bVar3 ^ 0xff;
          }
          if ((bVar10 & 1) != 0) {
            EVar4 = DebugUtils::errored(0x2a);
            return EVar4;
          }
        }
      }
    }
    else {
      bVar3 = Support::test<asmjit::v1_14::InstOptions,asmjit::v1_14::InstOptions>
                        (local_958,kX86_ZMask|kX86_SAE|kX86_ER);
      if ((bVar3) ||
         (bVar3 = Support::test<asmjit::v1_14::InstOptions,asmjit::v1_14::InstOptions>
                            (local_958,kX86_Repne|kX86_Rep), !bVar3)) {
        EVar4 = DebugUtils::errored(0x1a);
        return EVar4;
      }
    }
  }
  local_3c = 0;
  if (*puVar9 != 0) {
    local_240 = puVar9;
    local_38 = puVar9;
    bVar3 = Support::test<asmjit::v1_14::InstOptions,asmjit::v1_14::InstOptions>
                      (local_958,kX86_Repne|kX86_Rep);
    if (bVar3) {
      bVar3 = Support::
              test<asmjit::v1_14::x86::InstDB::InstFlags,asmjit::v1_14::x86::InstDB::InstFlags>
                        (local_96c,kRepIgnored);
      if (bVar3) {
        EVar4 = DebugUtils::errored(0x26);
        return EVar4;
      }
      local_238 = puVar9;
      if ((local_930[3] < 0xff) && (local_228 = puVar9, local_930[3] != 1)) {
        EVar4 = DebugUtils::errored(0x26);
        return EVar4;
      }
      bVar3 = true;
      if (local_9c0 != (Operand_ *)0x0) {
        local_830 = local_9c0;
        local_1a0 = local_9c0;
        local_198 = local_9c0;
        bVar3 = ((byte)(*puVar9 >> 3) & 0x1f) != ((byte)((local_9c0->_signature)._bits >> 3) & 0x1f)
        ;
        local_218 = puVar9;
        local_200 = puVar9;
        local_1d8 = puVar9;
      }
      if (bVar3) {
        EVar4 = DebugUtils::errored(0x26);
        return EVar4;
      }
    }
    else {
      local_278 = local_968;
      local_27c = 0x800000;
      bVar3 = Support::test<unsigned_int,asmjit::v1_14::x86::InstDB::InstFlags>(*local_968,kEvex);
      if (!bVar3) {
        EVar4 = DebugUtils::errored(0x26);
        return EVar4;
      }
      local_220 = puVar9;
      local_1f8 = puVar9;
      local_1e0 = puVar9;
      if (((byte)(*puVar9 >> 3) & 0x1f) != 0x11) {
        EVar4 = DebugUtils::errored(0x26);
        return EVar4;
      }
      bVar10 = 1;
      local_230 = puVar9;
      if (local_930[3] != 0) {
        local_210 = local_968;
        local_168 = local_968;
        local_16c = 1;
        bVar3 = Support::test<unsigned_int,asmjit::v1_14::x86::InstDB::Avx512Flags>
                          (local_968[1] & 0x7ff,kK);
        bVar10 = bVar3 ^ 0xff;
      }
      if ((bVar10 & 1) != 0) {
        EVar4 = DebugUtils::errored(0x27);
        return EVar4;
      }
    }
  }
  return 0;
}

Assistant:

static ASMJIT_FAVOR_SIZE Error validate(InstDB::Mode mode, const BaseInst& inst, const Operand_* operands, size_t opCount, ValidationFlags validationFlags) noexcept {
  uint32_t i;

  // Get the instruction data.
  const X86ValidationData* vd = (mode == InstDB::Mode::kX86) ? &_x86ValidationData : &_x64ValidationData;
  InstId instId = inst.id();
  InstOptions options = inst.options();

  if (ASMJIT_UNLIKELY(!Inst::isDefinedId(instId)))
    return DebugUtils::errored(kErrorInvalidInstruction);

  const InstDB::InstInfo& instInfo = InstDB::infoById(instId);
  const InstDB::CommonInfo& commonInfo = instInfo.commonInfo();

  InstDB::InstFlags iFlags = instInfo.flags();

  constexpr InstOptions kRepAny = InstOptions::kX86_Rep | InstOptions::kX86_Repne;
  constexpr InstOptions kXAcqXRel = InstOptions::kX86_XAcquire | InstOptions::kX86_XRelease;
  constexpr InstOptions kAvx512Options = InstOptions::kX86_ZMask | InstOptions::kX86_ER | InstOptions::kX86_SAE;

  // Validate LOCK|XACQUIRE|XRELEASE Prefixes
  // ----------------------------------------

  if (Support::test(options, InstOptions::kX86_Lock | kXAcqXRel)) {
    if (Support::test(options, InstOptions::kX86_Lock)) {
      if (ASMJIT_UNLIKELY(!Support::test(iFlags, InstDB::InstFlags::kLock) && !Support::test(options, kXAcqXRel)))
        return DebugUtils::errored(kErrorInvalidLockPrefix);

      if (ASMJIT_UNLIKELY(opCount < 1 || !operands[0].isMem()))
        return DebugUtils::errored(kErrorInvalidLockPrefix);
    }

    if (Support::test(options, kXAcqXRel)) {
      if (ASMJIT_UNLIKELY(!Support::test(options, InstOptions::kX86_Lock) || (options & kXAcqXRel) == kXAcqXRel))
        return DebugUtils::errored(kErrorInvalidPrefixCombination);

      if (ASMJIT_UNLIKELY(Support::test(options, InstOptions::kX86_XAcquire) && !Support::test(iFlags, InstDB::InstFlags::kXAcquire)))
        return DebugUtils::errored(kErrorInvalidXAcquirePrefix);

      if (ASMJIT_UNLIKELY(Support::test(options, InstOptions::kX86_XRelease) && !Support::test(iFlags, InstDB::InstFlags::kXRelease)))
        return DebugUtils::errored(kErrorInvalidXReleasePrefix);
    }
  }

  // Validate REP and REPNE Prefixes
  // -------------------------------

  if (Support::test(options, kRepAny)) {
    if (ASMJIT_UNLIKELY((options & kRepAny) == kRepAny))
      return DebugUtils::errored(kErrorInvalidPrefixCombination);

    if (ASMJIT_UNLIKELY(!Support::test(iFlags, InstDB::InstFlags::kRep)))
      return DebugUtils::errored(kErrorInvalidRepPrefix);
  }

  // Translate Each Operand to the Corresponding OpSignature
  // -------------------------------------------------------

  InstDB::OpSignature oSigTranslated[Globals::kMaxOpCount];
  InstDB::OpFlags combinedOpFlags = InstDB::OpFlags::kNone;
  uint32_t combinedRegMask = 0;
  const Mem* memOp = nullptr;

  for (i = 0; i < opCount; i++) {
    const Operand_& op = operands[i];
    if (op.opType() == OperandType::kNone)
      break;

    InstDB::OpFlags opFlags = InstDB::OpFlags::kNone;
    RegMask regMask = 0;

    switch (op.opType()) {
      case OperandType::kReg: {
        RegType regType = op.as<BaseReg>().type();
        opFlags = _x86OpFlagFromRegType[size_t(regType)];

        if (ASMJIT_UNLIKELY(opFlags == InstDB::OpFlags::kNone))
          return DebugUtils::errored(kErrorInvalidRegType);

        // If `regId` is equal or greater than Operand::kVirtIdMin it means that the register is virtual and its
        // index will be assigned later by the register allocator. We must pass unless asked to disallow virtual
        // registers.
        uint32_t regId = op.id();
        if (regId < Operand::kVirtIdMin) {
          if (ASMJIT_UNLIKELY(regId >= 32))
            return DebugUtils::errored(kErrorInvalidPhysId);

          if (ASMJIT_UNLIKELY(Support::bitTest(vd->allowedRegMask[size_t(regType)], regId) == 0))
            return DebugUtils::errored(kErrorInvalidPhysId);

          regMask = Support::bitMask(regId);
          combinedRegMask |= regMask;
        }
        else {
          if (uint32_t(validationFlags & ValidationFlags::kEnableVirtRegs) == 0)
            return DebugUtils::errored(kErrorIllegalVirtReg);
          regMask = 0xFFFFFFFFu;
        }
        break;
      }

      // TODO: Validate base and index and combine these with `combinedRegMask`.
      case OperandType::kMem: {
        const Mem& m = op.as<Mem>();
        memOp = &m;

        uint32_t memSize = m.size();
        RegType baseType = m.baseType();
        RegType indexType = m.indexType();

        if (m.segmentId() > 6)
          return DebugUtils::errored(kErrorInvalidSegment);

        // Validate AVX-512 broadcast {1tox}.
        if (m.hasBroadcast()) {
          if (memSize != 0) {
            // If the size is specified it has to match the broadcast size.
            if (ASMJIT_UNLIKELY(commonInfo.hasAvx512B32() && memSize != 4))
              return DebugUtils::errored(kErrorInvalidBroadcast);

            if (ASMJIT_UNLIKELY(commonInfo.hasAvx512B64() && memSize != 8))
              return DebugUtils::errored(kErrorInvalidBroadcast);
          }
          else {
            // If there is no size we implicitly calculate it so we can validate N in {1toN} properly.
            memSize = commonInfo.hasAvx512B64() ? 8 :
                      commonInfo.hasAvx512B32() ? 4 : 2;
          }

          memSize <<= uint32_t(m.getBroadcast());
        }

        if (baseType != RegType::kNone && baseType > RegType::kLabelTag) {
          uint32_t baseId = m.baseId();

          if (m.isRegHome()) {
            // Home address of a virtual register. In such case we don't want to validate the type of the
            // base register as it will always be patched to ESP|RSP.
          }
          else {
            if (ASMJIT_UNLIKELY(!Support::bitTest(vd->allowedMemBaseRegs, baseType)))
              return DebugUtils::errored(kErrorInvalidAddress);
          }

          // Create information that will be validated only if this is an implicit memory operand. Basically
          // only usable for string instructions and other instructions where memory operand is implicit and
          // has 'seg:[reg]' form.
          if (baseId < Operand::kVirtIdMin) {
            if (ASMJIT_UNLIKELY(baseId >= 32))
              return DebugUtils::errored(kErrorInvalidPhysId);

            // Physical base id.
            regMask = Support::bitMask(baseId);
            combinedRegMask |= regMask;
          }
          else {
            // Virtual base id - fill the whole mask for implicit mem validation. The register is not assigned
            // yet, so we cannot predict the phys id.
            if (uint32_t(validationFlags & ValidationFlags::kEnableVirtRegs) == 0)
              return DebugUtils::errored(kErrorIllegalVirtReg);
            regMask = 0xFFFFFFFFu;
          }

          if (indexType == RegType::kNone && !m.offsetLo32())
            opFlags |= InstDB::OpFlags::kFlagMemBase;
        }
        else if (baseType == RegType::kLabelTag) {
          // [Label] - there is no need to validate the base as it's label.
        }
        else {
          // Base is a 64-bit address.
          int64_t offset = m.offset();
          if (!Support::isInt32(offset)) {
            if (mode == InstDB::Mode::kX86) {
              // 32-bit mode: Make sure that the address is either `int32_t` or `uint32_t`.
              if (!Support::isUInt32(offset))
                return DebugUtils::errored(kErrorInvalidAddress64Bit);
            }
            else {
              // 64-bit mode: Zero extension is allowed if the address has 32-bit index register or the address
              // has no index register (it's still encodable).
              if (indexType != RegType::kNone) {
                if (!Support::isUInt32(offset))
                  return DebugUtils::errored(kErrorInvalidAddress64Bit);

                if (indexType != RegType::kX86_Gpd)
                  return DebugUtils::errored(kErrorInvalidAddress64BitZeroExtension);
              }
              else {
                // We don't validate absolute 64-bit addresses without an index register as this also depends
                // on the target's base address. We don't have the information to do it at this moment.
              }
            }
          }
        }

        if (indexType != RegType::kNone) {
          if (ASMJIT_UNLIKELY(!Support::bitTest(vd->allowedMemIndexRegs, indexType)))
            return DebugUtils::errored(kErrorInvalidAddress);

          if (indexType == RegType::kX86_Xmm) {
            opFlags |= InstDB::OpFlags::kVm32x | InstDB::OpFlags::kVm64x;
          }
          else if (indexType == RegType::kX86_Ymm) {
            opFlags |= InstDB::OpFlags::kVm32y | InstDB::OpFlags::kVm64y;
          }
          else if (indexType == RegType::kX86_Zmm) {
            opFlags |= InstDB::OpFlags::kVm32z | InstDB::OpFlags::kVm64z;
          }
          else {
            if (baseType != RegType::kNone)
              opFlags |= InstDB::OpFlags::kFlagMib;
          }

          // [RIP + {XMM|YMM|ZMM}] is not allowed.
          if (baseType == RegType::kX86_Rip && Support::test(opFlags, InstDB::OpFlags::kVmMask))
            return DebugUtils::errored(kErrorInvalidAddress);

          uint32_t indexId = m.indexId();
          if (indexId < Operand::kVirtIdMin) {
            if (ASMJIT_UNLIKELY(indexId >= 32))
              return DebugUtils::errored(kErrorInvalidPhysId);

            combinedRegMask |= Support::bitMask(indexId);
          }
          else {
            if (uint32_t(validationFlags & ValidationFlags::kEnableVirtRegs) == 0)
              return DebugUtils::errored(kErrorIllegalVirtReg);
          }

          // Only used for implicit memory operands having 'seg:[reg]' form, so clear it.
          regMask = 0;
        }

        switch (memSize) {
          case  0: opFlags |= InstDB::OpFlags::kMemUnspecified; break;
          case  1: opFlags |= InstDB::OpFlags::kMem8; break;
          case  2: opFlags |= InstDB::OpFlags::kMem16; break;
          case  4: opFlags |= InstDB::OpFlags::kMem32; break;
          case  6: opFlags |= InstDB::OpFlags::kMem48; break;
          case  8: opFlags |= InstDB::OpFlags::kMem64; break;
          case 10: opFlags |= InstDB::OpFlags::kMem80; break;
          case 16: opFlags |= InstDB::OpFlags::kMem128; break;
          case 32: opFlags |= InstDB::OpFlags::kMem256; break;
          case 64: opFlags |= InstDB::OpFlags::kMem512; break;

          default:
            return DebugUtils::errored(kErrorInvalidOperandSize);
        }

        break;
      }

      case OperandType::kImm: {
        uint64_t immValue = op.as<Imm>().valueAs<uint64_t>();

        if (int64_t(immValue) >= 0) {
          if (immValue <= 0x7u)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmU64 | InstDB::OpFlags::kImmI32 | InstDB::OpFlags::kImmU32 |
                      InstDB::OpFlags::kImmI16 | InstDB::OpFlags::kImmU16 | InstDB::OpFlags::kImmI8  | InstDB::OpFlags::kImmU8  |
                      InstDB::OpFlags::kImmI4  | InstDB::OpFlags::kImmU4  ;
          else if (immValue <= 0xFu)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmU64 | InstDB::OpFlags::kImmI32 | InstDB::OpFlags::kImmU32 |
                      InstDB::OpFlags::kImmI16 | InstDB::OpFlags::kImmU16 | InstDB::OpFlags::kImmI8  | InstDB::OpFlags::kImmU8  |
                      InstDB::OpFlags::kImmU4  ;
          else if (immValue <= 0x7Fu)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmU64 | InstDB::OpFlags::kImmI32 | InstDB::OpFlags::kImmU32 |
                      InstDB::OpFlags::kImmI16 | InstDB::OpFlags::kImmU16 | InstDB::OpFlags::kImmI8  | InstDB::OpFlags::kImmU8  ;
          else if (immValue <= 0xFFu)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmU64 | InstDB::OpFlags::kImmI32 | InstDB::OpFlags::kImmU32 |
                      InstDB::OpFlags::kImmI16 | InstDB::OpFlags::kImmU16 | InstDB::OpFlags::kImmU8  ;
          else if (immValue <= 0x7FFFu)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmU64 | InstDB::OpFlags::kImmI32 | InstDB::OpFlags::kImmU32 |
                      InstDB::OpFlags::kImmI16 | InstDB::OpFlags::kImmU16 ;
          else if (immValue <= 0xFFFFu)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmU64 | InstDB::OpFlags::kImmI32 | InstDB::OpFlags::kImmU32 |
                      InstDB::OpFlags::kImmU16 ;
          else if (immValue <= 0x7FFFFFFFu)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmU64 | InstDB::OpFlags::kImmI32 | InstDB::OpFlags::kImmU32;
          else if (immValue <= 0xFFFFFFFFu)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmU64 | InstDB::OpFlags::kImmU32;
          else if (immValue <= 0x7FFFFFFFFFFFFFFFu)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmU64;
          else
            opFlags = InstDB::OpFlags::kImmU64;
        }
        else {
          immValue = Support::neg(immValue);
          if (immValue <= 0x8u)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmI32 | InstDB::OpFlags::kImmI16 | InstDB::OpFlags::kImmI8 | InstDB::OpFlags::kImmI4;
          else if (immValue <= 0x80u)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmI32 | InstDB::OpFlags::kImmI16 | InstDB::OpFlags::kImmI8;
          else if (immValue <= 0x8000u)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmI32 | InstDB::OpFlags::kImmI16;
          else if (immValue <= 0x80000000u)
            opFlags = InstDB::OpFlags::kImmI64 | InstDB::OpFlags::kImmI32;
          else
            opFlags = InstDB::OpFlags::kImmI64;
        }
        break;
      }

      case OperandType::kLabel: {
        opFlags |= InstDB::OpFlags::kRel8 | InstDB::OpFlags::kRel32;
        break;
      }

      default:
        return DebugUtils::errored(kErrorInvalidState);
    }

    InstDB::OpSignature& oSigDst = oSigTranslated[i];
    oSigDst._flags = uint64_t(opFlags) & 0x00FFFFFFFFFFFFFFu;
    oSigDst._regMask = uint8_t(regMask & 0xFFu);
    combinedOpFlags |= opFlags;
  }

  // Decrease the number of operands of those that are none. This is important as Assembler and Compiler may just pass
  // more operands padded with none (which means that no operand is given at that index). However, validate that there
  // are no gaps (like [reg, none, reg] or [none, reg]).
  if (i < opCount) {
    while (--opCount > i)
      if (ASMJIT_UNLIKELY(!operands[opCount].isNone()))
        return DebugUtils::errored(kErrorInvalidInstruction);
  }

  // Validate X86 and X64 specific cases.
  if (mode == InstDB::Mode::kX86) {
    // Illegal use of 64-bit register in 32-bit mode.
    if (ASMJIT_UNLIKELY(Support::test(combinedOpFlags, InstDB::OpFlags::kRegGpq)))
      return DebugUtils::errored(kErrorInvalidUseOfGpq);
  }
  else {
    // Illegal use of a high 8-bit register with REX prefix.
    bool hasREX = inst.hasOption(InstOptions::kX86_Rex) || (combinedRegMask & 0xFFFFFF00u) != 0;
    if (ASMJIT_UNLIKELY(hasREX && Support::test(combinedOpFlags, InstDB::OpFlags::kRegGpbHi)))
      return DebugUtils::errored(kErrorInvalidUseOfGpbHi);
  }

  // Validate Instruction Signature by Comparing Against All `iSig` Rows
  // -------------------------------------------------------------------

  const InstDB::InstSignature* iSig = InstDB::_instSignatureTable + commonInfo._iSignatureIndex;
  const InstDB::InstSignature* iEnd = iSig + commonInfo._iSignatureCount;

  if (iSig != iEnd) {
    const InstDB::OpSignature* opSignatureTable = InstDB::_opSignatureTable;

    // If set it means that we matched a signature where only immediate value
    // was out of bounds. We can return a more descriptive error if we know this.
    bool globalImmOutOfRange = false;

    do {
      // Check if the architecture is compatible.
      if (!iSig->supportsMode(mode))
        continue;

      // Compare the operands table with reference operands.
      uint32_t j = 0;
      uint32_t iSigCount = iSig->opCount();
      bool localImmOutOfRange = false;

      if (iSigCount == opCount) {
        for (j = 0; j < opCount; j++)
          if (!x86CheckOSig(oSigTranslated[j], iSig->opSignature(j), localImmOutOfRange))
            break;
      }
      else if (iSigCount - iSig->implicitOpCount() == opCount) {
        uint32_t r = 0;
        for (j = 0; j < opCount && r < iSigCount; j++, r++) {
          const InstDB::OpSignature* oChk = oSigTranslated + j;
          const InstDB::OpSignature* oRef;
Next:
          oRef = opSignatureTable + iSig->opSignatureIndex(r);
          // Skip implicit operands.
          if (oRef->isImplicit()) {
            if (++r >= iSigCount)
              break;
            else
              goto Next;
          }

          if (!x86CheckOSig(*oChk, *oRef, localImmOutOfRange))
            break;
        }
      }

      if (j == opCount) {
        if (!localImmOutOfRange) {
          // Match, must clear possible `globalImmOutOfRange`.
          globalImmOutOfRange = false;
          break;
        }
        globalImmOutOfRange = localImmOutOfRange;
      }
    } while (++iSig != iEnd);

    if (iSig == iEnd) {
      if (globalImmOutOfRange)
        return DebugUtils::errored(kErrorInvalidImmediate);
      else
        return DebugUtils::errored(kErrorInvalidInstruction);
    }
  }

  // Validate AVX512 Options
  // -----------------------

  const RegOnly& extraReg = inst.extraReg();

  if (Support::test(options, kAvx512Options)) {
    if (commonInfo.hasFlag(InstDB::InstFlags::kEvex)) {
      // Validate AVX-512 {z}.
      if (Support::test(options, InstOptions::kX86_ZMask)) {
        if (ASMJIT_UNLIKELY(Support::test(options, InstOptions::kX86_ZMask) && !commonInfo.hasAvx512Z()))
          return DebugUtils::errored(kErrorInvalidKZeroUse);
      }

      // Validate AVX-512 {sae} and {er}.
      if (Support::test(options, InstOptions::kX86_SAE | InstOptions::kX86_ER)) {
        // Rounding control is impossible if the instruction is not reg-to-reg.
        if (ASMJIT_UNLIKELY(memOp))
          return DebugUtils::errored(kErrorInvalidEROrSAE);

        // Check if {sae} or {er} is supported by the instruction.
        if (Support::test(options, InstOptions::kX86_ER)) {
          // NOTE: if both {sae} and {er} are set, we don't care, as {sae} is implied.
          if (ASMJIT_UNLIKELY(!commonInfo.hasAvx512ER()))
            return DebugUtils::errored(kErrorInvalidEROrSAE);
        }
        else {
          if (ASMJIT_UNLIKELY(!commonInfo.hasAvx512SAE()))
            return DebugUtils::errored(kErrorInvalidEROrSAE);
        }

        // {sae} and {er} are defined for either scalar ops or vector ops that require LL to be 10 (512-bit vector
        // operations). We don't need any more bits in the instruction database to be able to validate this, as
        // each AVX512 instruction that has broadcast is vector instruction (in this case we require zmm registers),
        // otherwise it's a scalar instruction, which is valid.
        if (commonInfo.hasAvx512B()) {
          // Supports broadcast, thus we require LL to be '10', which means there have to be ZMM registers used. We
          // don't calculate LL here, but we know that it would be '10' if there is at least one ZMM register used.

          // There is no {er}/{sae}-enabled instruction with less than two operands.
          ASMJIT_ASSERT(opCount >= 2);
          if (ASMJIT_UNLIKELY(!x86IsZmmOrM512(operands[0]) && !x86IsZmmOrM512(operands[1])))
            return DebugUtils::errored(kErrorInvalidEROrSAE);
        }
      }
    }
    else {
      // Not an AVX512 instruction - maybe OpExtra is xCX register used by REP/REPNE prefix.
      if (Support::test(options, kAvx512Options) || !Support::test(options, kRepAny))
        return DebugUtils::errored(kErrorInvalidInstruction);
    }
  }

  // Validate {Extra} Register
  // -------------------------

  if (extraReg.isReg()) {
    if (Support::test(options, kRepAny)) {
      // Validate REP|REPNE {cx|ecx|rcx}.
      if (ASMJIT_UNLIKELY(Support::test(iFlags, InstDB::InstFlags::kRepIgnored)))
        return DebugUtils::errored(kErrorInvalidExtraReg);

      if (extraReg.isPhysReg()) {
        if (ASMJIT_UNLIKELY(extraReg.id() != Gp::kIdCx))
          return DebugUtils::errored(kErrorInvalidExtraReg);
      }

      // The type of the {...} register must match the type of the base register
      // of memory operand. So if the memory operand uses 32-bit register the
      // count register must also be 32-bit, etc...
      if (ASMJIT_UNLIKELY(!memOp || extraReg.type() != memOp->baseType()))
        return DebugUtils::errored(kErrorInvalidExtraReg);
    }
    else if (commonInfo.hasFlag(InstDB::InstFlags::kEvex)) {
      // Validate AVX-512 {k}.
      if (ASMJIT_UNLIKELY(extraReg.type() != RegType::kX86_KReg))
        return DebugUtils::errored(kErrorInvalidExtraReg);

      if (ASMJIT_UNLIKELY(extraReg.id() == 0 || !commonInfo.hasAvx512K()))
        return DebugUtils::errored(kErrorInvalidKMaskUse);
    }
    else {
      return DebugUtils::errored(kErrorInvalidExtraReg);
    }
  }

  return kErrorOk;
}